

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

char * fmt_node(adh_node_t *node)

{
  if (node == (adh_node_t *)0x0) {
    fmt_node::str[0] = ' ';
    fmt_node::str[1] = '\0';
  }
  else {
    fmt_symbol(node->symbol);
    snprintf(fmt_node::str,100,"%s (%3u,%6u)",fmt_symbol::str,(ulong)node->order,(ulong)node->weight
            );
  }
  return fmt_node::str;
}

Assistant:

char * fmt_node(const adh_node_t* node) {
    static char str[MAX_SYMBOL_STR] = {0};
    if(node)
        snprintf(str, sizeof(str), "%s (%3u,%6u)", fmt_symbol(node->symbol), node->order, node->weight);
    else
        snprintf(str, sizeof(str), " ");

    return str;
}